

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * __thiscall
httplib::detail::
message_digest<SHA512state_st,int(*)(SHA512state_st*),int(*)(SHA512state_st*,void_const*,unsigned_long),int(*)(unsigned_char*,SHA512state_st*)>
          (string *__return_storage_ptr__,detail *this,string *s,_func_int_SHA512state_st_ptr *init,
          _func_int_SHA512state_st_ptr_void_ptr_unsigned_long *update,
          _func_int_uchar_ptr_SHA512state_st_ptr *final,size_t digest_length)

{
  byte bVar1;
  bool bVar2;
  _Setfill<char> _Var3;
  _Setw _Var4;
  SHA512state_st *pSVar5;
  byte *pbVar6;
  ostream *poVar7;
  unsigned_long extraout_RDX;
  iterator iStack_2e0;
  uchar c;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range2;
  stringstream ss;
  undefined1 local_2b8 [376];
  undefined1 local_140 [8];
  SHA512state_st ctx;
  allocator<unsigned_char> local_52;
  value_type_conflict3 local_51;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> md;
  size_t digest_length_local;
  _func_int_uchar_ptr_SHA512state_st_ptr *final_local;
  _func_int_SHA512state_st_ptr_void_ptr_unsigned_long *update_local;
  _func_int_SHA512state_st_ptr *init_local;
  string *s_local;
  
  local_51 = '\0';
  md.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)final;
  std::allocator<unsigned_char>::allocator(&local_52);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,(size_type)final,
             &local_51,&local_52);
  std::allocator<unsigned_char>::~allocator(&local_52);
  (*(code *)s)(local_140);
  std::__cxx11::string::data();
  std::__cxx11::string::size();
  (*init)((SHA512state_st *)local_140);
  pSVar5 = (SHA512state_st *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  (*update)(pSVar5,local_140,extraout_RDX);
  std::__cxx11::stringstream::stringstream((stringstream *)&__range2);
  __end2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  iStack_2e0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffd20);
    if (!bVar2) break;
    pbVar6 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&__end2);
    bVar1 = *pbVar6;
    _Var3 = std::setfill<char>('0');
    poVar7 = std::operator<<(local_2b8,_Var3._M_c);
    _Var4 = std::setw(2);
    poVar7 = std::operator<<(poVar7,_Var4);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::hex);
    std::ostream::operator<<(poVar7,(uint)bVar1);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

inline std::string message_digest(const std::string &s, Init init,
                                  Update update, Final final,
                                  size_t digest_length) {
  using namespace std;

  std::vector<unsigned char> md(digest_length, 0);
  CTX ctx;
  init(&ctx);
  update(&ctx, s.data(), s.size());
  final(md.data(), &ctx);

  stringstream ss;
  for (auto c : md) {
    ss << setfill('0') << setw(2) << hex << (unsigned int)c;
  }
  return ss.str();
}